

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::ImportWriter::AddFile
          (ImportWriter *this,FileDescriptor *file,string *header_extension)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  pointer pcVar4;
  bool bVar5;
  long *plVar6;
  iterator iVar7;
  undefined8 *puVar8;
  ulong *puVar9;
  FileDescriptor *file_00;
  FileDescriptor *file_01;
  FileDescriptor *file_02;
  undefined8 uVar10;
  _Alloc_hider _Var11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string file_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  long local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  string local_60;
  string local_40;
  
  FilePath_abi_cxx11_(&local_40,(objectivec *)file,(FileDescriptor *)header_extension);
  bVar5 = IsProtobufLibraryBundledProtoFile(file);
  if (bVar5) {
    FilePathBasename_abi_cxx11_(&local_a0,(objectivec *)file,file_00);
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_a0,(ulong)(header_extension->_M_dataplus)._M_p);
    paVar2 = &local_c0.field_2;
    puVar9 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar9) {
      local_c0.field_2._M_allocated_capacity = *puVar9;
      local_c0.field_2._8_8_ = plVar6[3];
      local_c0._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_c0.field_2._M_allocated_capacity = *puVar9;
      local_c0._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_c0._M_string_length = plVar6[1];
    *plVar6 = (long)puVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->protobuf_framework_imports_,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_c0,&local_40,header_extension);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->protobuf_non_framework_imports_,&local_c0);
    local_70._M_allocated_capacity = local_c0.field_2._M_allocated_capacity;
    _Var11._M_p = local_c0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p == paVar2) goto LAB_00235a51;
  }
  else {
    if (this->need_to_parse_mapping_file_ == true) {
      ParseFrameworkMappings(this);
    }
    iVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(this->proto_file_to_framework_name_)._M_t,*(key_type **)file);
    if ((_Rb_tree_header *)iVar7._M_node ==
        &(this->proto_file_to_framework_name_)._M_t._M_impl.super__Rb_tree_header) {
      sVar3 = (this->generate_for_named_framework_)._M_string_length;
      if (sVar3 == 0) {
        std::operator+(&local_c0,&local_40,header_extension);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->other_imports_,&local_c0);
        local_70._M_allocated_capacity = local_c0.field_2._M_allocated_capacity;
        _Var11._M_p = local_c0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p == &local_c0.field_2) goto LAB_00235a51;
        goto LAB_00235a49;
      }
      pcVar4 = (this->generate_for_named_framework_)._M_dataplus._M_p;
      local_80 = &local_70;
      std::__cxx11::string::_M_construct<char*>((string *)&local_80,pcVar4,pcVar4 + sVar3);
      std::__cxx11::string::append((char *)&local_80);
      FilePathBasename_abi_cxx11_(&local_60,(objectivec *)file,file_02);
      uVar10 = 0xf;
      if (local_80 != &local_70) {
        uVar10 = local_70._M_allocated_capacity;
      }
      if ((ulong)uVar10 < local_60._M_string_length + local_78) {
        uVar10 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          uVar10 = local_60.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar10 < local_60._M_string_length + local_78) goto LAB_0023577b;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_80);
      }
      else {
LAB_0023577b:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_60._M_dataplus._M_p)
        ;
      }
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      psVar1 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar1) {
        local_a0.field_2._M_allocated_capacity = *psVar1;
        local_a0.field_2._8_8_ = puVar8[3];
      }
      else {
        local_a0.field_2._M_allocated_capacity = *psVar1;
        local_a0._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_a0._M_string_length = puVar8[1];
      *puVar8 = psVar1;
      puVar8[1] = 0;
      *(undefined1 *)psVar1 = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_a0,(ulong)(header_extension->_M_dataplus)._M_p);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      puVar9 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_c0.field_2._M_allocated_capacity = *puVar9;
        local_c0.field_2._8_8_ = plVar6[3];
      }
      else {
        local_c0.field_2._M_allocated_capacity = *puVar9;
        local_c0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_c0._M_string_length = plVar6[1];
      *plVar6 = (long)puVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->other_framework_imports_,&local_c0);
    }
    else {
      local_80 = &local_70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,*(long *)(iVar7._M_node + 2),
                 (long)&(iVar7._M_node[2]._M_parent)->_M_color + *(long *)(iVar7._M_node + 2));
      std::__cxx11::string::append((char *)&local_80);
      FilePathBasename_abi_cxx11_(&local_60,(objectivec *)file,file_01);
      uVar10 = 0xf;
      if (local_80 != &local_70) {
        uVar10 = local_70._M_allocated_capacity;
      }
      if ((ulong)uVar10 < local_60._M_string_length + local_78) {
        uVar10 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          uVar10 = local_60.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar10 < local_60._M_string_length + local_78) goto LAB_002356dd;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_80);
      }
      else {
LAB_002356dd:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_60._M_dataplus._M_p)
        ;
      }
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      psVar1 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar1) {
        local_a0.field_2._M_allocated_capacity = *psVar1;
        local_a0.field_2._8_8_ = puVar8[3];
      }
      else {
        local_a0.field_2._M_allocated_capacity = *psVar1;
        local_a0._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_a0._M_string_length = puVar8[1];
      *puVar8 = psVar1;
      puVar8[1] = 0;
      *(undefined1 *)psVar1 = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_a0,(ulong)(header_extension->_M_dataplus)._M_p);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      puVar9 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_c0.field_2._M_allocated_capacity = *puVar9;
        local_c0.field_2._8_8_ = plVar6[3];
      }
      else {
        local_c0.field_2._M_allocated_capacity = *puVar9;
        local_c0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_c0._M_string_length = plVar6[1];
      *plVar6 = (long)puVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->other_framework_imports_,&local_c0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    _Var11._M_p = (pointer)local_80;
    if (local_80 == &local_70) goto LAB_00235a51;
  }
LAB_00235a49:
  operator_delete(_Var11._M_p,local_70._M_allocated_capacity + 1);
LAB_00235a51:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ImportWriter::AddFile(const FileDescriptor* file,
                           const string& header_extension) {
  const string file_path(FilePath(file));

  if (IsProtobufLibraryBundledProtoFile(file)) {
    protobuf_framework_imports_.push_back(
        FilePathBasename(file) + header_extension);
    protobuf_non_framework_imports_.push_back(file_path + header_extension);
    return;
  }

  // Lazy parse any mappings.
  if (need_to_parse_mapping_file_) {
    ParseFrameworkMappings();
  }

  map<string, string>::iterator proto_lookup =
      proto_file_to_framework_name_.find(file->name());
  if (proto_lookup != proto_file_to_framework_name_.end()) {
    other_framework_imports_.push_back(
        proto_lookup->second + "/" +
        FilePathBasename(file) + header_extension);
    return;
  }

  if (!generate_for_named_framework_.empty()) {
    other_framework_imports_.push_back(
        generate_for_named_framework_ + "/" +
        FilePathBasename(file) + header_extension);
    return;
  }

  other_imports_.push_back(file_path + header_extension);
}